

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

int set_parameters_from_string(char **file_content,char *name)

{
  int iVar1;
  parset pVar2;
  size_t sVar3;
  int (*paaaaiVar4) [5] [5] [5] [5];
  int *in_RCX;
  int (*paaaaiVar5) [5] [5] [5] [5];
  int (*paaiVar6) [5] [5];
  int (*paiVar7) [5];
  int (*array) [8] [5] [5] [5];
  int (*paaaiVar8) [8] [5] [5];
  size_t sVar9;
  int *piVar10;
  int (*paaaiVar11) [8] [5] [5];
  int (*paaiVar12) [5] [5];
  int *in_R8;
  int *in_R9;
  int (*array_00) [8] [5] [5] [5] [5];
  int *piVar13;
  long lVar14;
  char *pcVar15;
  long lVar16;
  int (*paaaaiVar17) [5] [5] [5] [5];
  int m;
  int (*paiVar18) [8];
  ulong uVar19;
  int (*paiVar20) [8];
  ulong uVar21;
  int (*paaaaiVar22) [5] [5] [5] [5];
  long lVar23;
  size_t local_1c0;
  int (*local_1b8) [5] [5] [5] [5];
  int (*local_1b0) [5] [5] [5] [5];
  int (*local_1a8) [5] [5] [5] [5];
  int (*local_1a0) [5] [5] [5] [5];
  int (*local_198) [5] [5] [5] [5];
  int (*local_190) [5] [5] [5] [5];
  int (*local_188) [5] [5] [5] [5];
  int (*local_180) [5] [5] [5] [5];
  int (*local_178) [5] [5] [5] [5];
  int (*local_170) [5] [5] [5] [5];
  int (*local_168) [5] [5] [5] [5];
  int (*local_160) [5] [5] [5] [5];
  int values [6];
  char ident [256];
  
  local_188 = (int (*) [5] [5] [5] [5])((ulong)local_188 & 0xffffffff00000000);
  if ((file_content != (char **)0x0) && (*file_content != (char *)0x0)) {
    free(last_param_file);
    if (name == (char *)0x0) {
      last_param_file = (char *)0x0;
    }
    else {
      last_param_file = strdup(name);
    }
    iVar1 = strncmp(*file_content,"## RNAfold parameter file v2.0",0x1e);
    if (iVar1 != 0) {
      vrna_message_warning
                (
                "Missing header line in file.\nMay be this file has not v2.0 format.\nUse INTERRUPT-key to stop."
                );
    }
    local_1a8 = (int (*) [5] [5] [5] [5])(file_content + 1);
    sVar9 = 1;
    local_1a0 = (int (*) [5] [5] [5] [5])file_content;
    while( true ) {
      local_1c0 = sVar9 + 1;
      if (file_content[sVar9] == (char *)0x0) break;
      iVar1 = __isoc99_sscanf(file_content[sVar9],"# %255s",ident);
      if (iVar1 != 1) goto switchD_0011ea01_caseD_0;
      pVar2 = gettype(ident);
      iVar1 = (int)in_R8;
      switch(pVar2) {
      case QUIT:
        goto switchD_0011ea01_caseD_0;
      case S:
        paiVar7 = (int (*) [5])stack37;
        goto LAB_0011ea13;
      case S_H:
        paiVar7 = (int (*) [5])stackdH;
LAB_0011ea13:
        in_RCX = stack_dim;
        in_R8 = stack_shift;
        goto LAB_0011eb1b;
      case HP:
        piVar10 = hairpin37;
        goto LAB_0011ea5a;
      case HP_H:
        piVar10 = hairpindH;
        goto LAB_0011ea5a;
      case B:
        piVar10 = bulge37;
        goto LAB_0011ea5a;
      case B_H:
        piVar10 = bulgedH;
        goto LAB_0011ea5a;
      case IL:
        piVar10 = internal_loop37;
        goto LAB_0011ea5a;
      case IL_H:
        piVar10 = internal_loopdH;
LAB_0011ea5a:
        in_RCX = (int *)0x1f;
        rd_1dim(file_content,&local_1c0,piVar10,0x1f,iVar1);
        goto switchD_0011ea01_caseD_0;
      case MMH:
        paaiVar6 = mismatchH37;
        break;
      case MMH_H:
        paaiVar6 = mismatchHdH;
        break;
      case MMI:
        paaiVar6 = mismatchI37;
        break;
      case MMI_H:
        paaiVar6 = mismatchIdH;
        break;
      case MMI1N:
        paaiVar6 = mismatch1nI37;
        break;
      case MMI1N_H:
        paaiVar6 = mismatch1nIdH;
        break;
      case MMI23:
        paaiVar6 = mismatch23I37;
        break;
      case MMI23_H:
        paaiVar6 = mismatch23IdH;
        break;
      case MMM:
        paaiVar6 = mismatchM37;
        break;
      case MMM_H:
        paaiVar6 = mismatchMdH;
        break;
      case MME:
        paaiVar6 = mismatchExt37;
        break;
      case MME_H:
        paaiVar6 = mismatchExtdH;
        break;
      case D5:
        paiVar7 = dangle5_37;
        goto LAB_0011eb0d;
      case D5_H:
        paiVar7 = dangle5_dH;
        goto LAB_0011eb0d;
      case D3:
        paiVar7 = dangle3_37;
        goto LAB_0011eb0d;
      case D3_H:
        paiVar7 = dangle3_dH;
LAB_0011eb0d:
        in_RCX = dangle_dim;
        in_R8 = dangle_shift;
LAB_0011eb1b:
        rd_2dim(file_content,&local_1c0,*paiVar7,in_RCX,in_R8);
        goto switchD_0011ea01_caseD_0;
      case INT11:
        paaaiVar8 = int11_37;
        goto LAB_0011eb3d;
      case INT11_H:
        paaaiVar8 = int11_dH;
LAB_0011eb3d:
        rd_4dim(file_content,&local_1c0,(int *)paaaiVar8,in_RCX,in_R8);
        goto switchD_0011ea01_caseD_0;
      case INT21:
        array = int21_37;
        goto LAB_0011eb5f;
      case INT21_H:
        array = int21_dH;
LAB_0011eb5f:
        rd_5dim(file_content,&local_1c0,(int *)array,in_RCX,in_R8);
        goto switchD_0011ea01_caseD_0;
      case INT22:
        array_00 = int22_37;
        goto LAB_0011eb81;
      case INT22_H:
        array_00 = int22_dH;
LAB_0011eb81:
        rd_6dim_slice(file_content,&local_1c0,(int *)array_00,in_RCX,in_R8,in_R9);
        update_nst(array_00);
        goto switchD_0011ea01_caseD_0;
      case ML:
        rd_1dim(file_content,&local_1c0,values,6,iVar1);
        ML_BASE37 = values[0];
        ML_BASEdH = values[1];
        ML_closing37 = values[2];
        ML_closingdH = values[3];
        ML_intern37 = values[4];
        in_RCX = &ML_interndH;
        iVar1 = values[5];
        goto LAB_0011ef0d;
      case TL:
        pcVar15 = Tetraloops;
        memset(Tetraloops,0,0x119);
        piVar10 = Tetraloop37;
        memset(Tetraloop37,0,0xa0);
        piVar13 = TetraloopdH;
        memset(TetraloopdH,0,0xa0);
        local_1b8 = (int (*) [5] [5] [5] [5])((long)local_1a8 + sVar9 * 8);
        uVar19 = 0;
        local_1b0 = (int (*) [5] [5] [5] [5])sVar9;
        do {
          uVar21 = uVar19;
          if (*(char **)((long)local_1b8 + uVar21 * 8) == (char *)0x0) break;
          in_RCX = piVar10;
          in_R8 = piVar13;
          iVar1 = __isoc99_sscanf(*(char **)((long)local_1b8 + uVar21 * 8),"%6s %d %d",pcVar15);
          sVar3 = strlen(Tetraloops);
          (Tetraloops + sVar3)[0] = ' ';
          (Tetraloops + sVar3)[1] = '\0';
          if (iVar1 != 3) break;
          piVar13 = piVar13 + 1;
          piVar10 = piVar10 + 1;
          pcVar15 = pcVar15 + 7;
          uVar19 = uVar21 + 1;
        } while (uVar21 < 0x27);
        goto LAB_0011ee4e;
      case TRI:
        pcVar15 = Triloops;
        memset(Triloops,0,0xf1);
        piVar10 = Triloop37;
        memset(Triloop37,0,0xa0);
        piVar13 = TriloopdH;
        memset(TriloopdH,0,0xa0);
        local_1b8 = (int (*) [5] [5] [5] [5])((long)local_1a8 + sVar9 * 8);
        uVar19 = 0;
        local_1b0 = (int (*) [5] [5] [5] [5])sVar9;
        do {
          uVar21 = uVar19;
          if (*(char **)((long)local_1b8 + uVar21 * 8) == (char *)0x0) break;
          in_RCX = piVar10;
          in_R8 = piVar13;
          iVar1 = __isoc99_sscanf(*(char **)((long)local_1b8 + uVar21 * 8),"%5s %d %d",pcVar15);
          sVar3 = strlen(Triloops);
          (Triloops + sVar3)[0] = ' ';
          (Triloops + sVar3)[1] = '\0';
          if (iVar1 != 3) break;
          piVar13 = piVar13 + 1;
          piVar10 = piVar10 + 1;
          pcVar15 = pcVar15 + 6;
          uVar19 = uVar21 + 1;
        } while (uVar21 < 0x27);
        goto LAB_0011ee4e;
      case HEX:
        pcVar15 = Hexaloops;
        memset(Hexaloops,0,0x169);
        piVar10 = Hexaloop37;
        memset(Hexaloop37,0,0xa0);
        piVar13 = HexaloopdH;
        memset(HexaloopdH,0,0xa0);
        local_1b8 = (int (*) [5] [5] [5] [5])((long)local_1a8 + sVar9 * 8);
        uVar19 = 0;
        local_1b0 = (int (*) [5] [5] [5] [5])sVar9;
        do {
          uVar21 = uVar19;
          if (*(char **)((long)local_1b8 + uVar21 * 8) == (char *)0x0) break;
          in_RCX = piVar10;
          in_R8 = piVar13;
          iVar1 = __isoc99_sscanf(*(char **)((long)local_1b8 + uVar21 * 8),"%8s %d %d",pcVar15);
          sVar3 = strlen(Hexaloops);
          (Hexaloops + sVar3)[0] = ' ';
          (Hexaloops + sVar3)[1] = '\0';
          if (iVar1 != 3) break;
          piVar13 = piVar13 + 1;
          piVar10 = piVar10 + 1;
          pcVar15 = pcVar15 + 9;
          uVar19 = uVar21 + 1;
        } while (uVar21 < 0x27);
LAB_0011ee4e:
        local_1c0 = (long)local_1b0 + uVar21 + 2;
        file_content = (char **)local_1a0;
        goto switchD_0011ea01_caseD_0;
      case NIN:
        rd_1dim(file_content,&local_1c0,values,3,iVar1);
        ninio37 = values[0];
        niniodH = values[1];
        in_RCX = &MAX_NINIO;
        iVar1 = values[2];
        goto LAB_0011ef0d;
      case MISC:
        rd_1dim(file_content,&local_1c0,values,4,iVar1);
        DuplexInit37 = values[0];
        DuplexInitdH = values[1];
        TerminalAU37 = values[2];
        in_RCX = &TerminalAUdH;
        iVar1 = values[3];
LAB_0011ef0d:
        *in_RCX = iVar1;
        goto switchD_0011ea01_caseD_0;
      default:
        vrna_message_warning("read_epars: Unknown field identifier in `%s\'");
        goto switchD_0011ea01_caseD_0;
      }
      rd_3dim(file_content,&local_1c0,(int *)paaiVar6,in_RCX,in_R8);
switchD_0011ea01_caseD_0:
      sVar9 = local_1c0;
    }
    paiVar18 = stack37;
    paiVar20 = stack37;
    for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
      for (lVar16 = 0; lVar16 != 0x20; lVar16 = lVar16 + 4) {
        if (*(int *)((long)*paiVar18 + lVar16) != *(int *)((long)paiVar20 + lVar16 * 2 * 4)) {
          vrna_message_warning("stacking energies not symmetric");
        }
      }
      paiVar20 = (int (*) [8])((long)paiVar20 + 4);
      paiVar18 = paiVar18 + 1;
    }
    paiVar18 = stackdH;
    paiVar20 = stackdH;
    for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
      for (lVar16 = 0; lVar16 != 0x20; lVar16 = lVar16 + 4) {
        if (*(int *)((long)*paiVar18 + lVar16) != *(int *)((long)paiVar20 + lVar16 * 2 * 4)) {
          vrna_message_warning("stacking enthalpies not symmetric");
        }
      }
      paiVar20 = (int (*) [8])((long)paiVar20 + 4);
      paiVar18 = paiVar18 + 1;
    }
    paaaiVar11 = int11_37;
    paaaiVar8 = int11_37;
    for (uVar19 = 0; uVar19 != 8; uVar19 = uVar19 + 1) {
      local_1a8 = (int (*) [5] [5] [5] [5])paaaiVar11;
      local_198 = (int (*) [5] [5] [5] [5])paaaiVar8;
      for (uVar21 = 0; uVar21 != 8; uVar21 = uVar21 + 1) {
        local_1b0 = (int (*) [5] [5] [5] [5])paaaiVar11;
        local_1a0 = (int (*) [5] [5] [5] [5])paaaiVar8;
        for (lVar14 = 0; lVar14 != 5; lVar14 = lVar14 + 1) {
          local_1b8 = (int (*) [5] [5] [5] [5])paaaiVar8;
          for (lVar16 = 0; lVar16 != 5; lVar16 = lVar16 + 1) {
            if ((*(int (*) [5] [5])*(int (*) [5])paaaiVar11)[0][lVar16] !=
                (*(int (*) [5] [5])*(int (*) [5])paaaiVar8)[0][0]) {
              vrna_message_warning
                        ("int11 energies not symmetric (%d,%d,%d,%d) (%d vs. %d)",
                         uVar19 & 0xffffffff,uVar21 & 0xffffffff);
            }
            paaaiVar8 = (int (*) [8] [5] [5])((long)paaaiVar8 + 0x14);
          }
          paaaiVar8 = (int (*) [8] [5] [5])((long)*local_1b8 + 4);
          paaaiVar11 = (int (*) [8] [5] [5])((long)paaaiVar11 + 0x14);
        }
        paaaiVar8 = (int (*) [8] [5] [5])((long)local_1a0 + 800);
        paaaiVar11 = (int (*) [8] [5] [5])((long)local_1b0 + 100);
      }
      paaaiVar8 = (int (*) [8] [5] [5])((long)local_198 + 100);
      paaaiVar11 = (int (*) [8] [5] [5])((long)local_1a8 + 800);
    }
    local_198 = (int (*) [5] [5] [5] [5])int11_dH;
    local_190 = (int (*) [5] [5] [5] [5])int11_dH;
    for (local_1a8 = (int (*) [5] [5] [5] [5])0x0; local_1a8 != (int (*) [5] [5] [5] [5])0x8;
        local_1a8 = (int (*) [5] [5] [5] [5])((long)local_1a8 + 1)) {
      paaiVar6 = (int (*) [5] [5])local_190;
      paiVar7 = (int (*) [5])local_198;
      for (local_1a0 = (int (*) [5] [5] [5] [5])0x0; local_1a0 != (int (*) [5] [5] [5] [5])0x8;
          local_1a0 = (int (*) [5] [5] [5] [5])((long)local_1a0 + 1)) {
        local_1b8 = (int (*) [5] [5] [5] [5])paiVar7;
        local_1b0 = (int (*) [5] [5] [5] [5])paaiVar6;
        for (lVar14 = 0; lVar14 != 5; lVar14 = lVar14 + 1) {
          paaiVar12 = paaiVar6;
          for (lVar16 = 0; lVar16 != 5; lVar16 = lVar16 + 1) {
            if ((*(int (*) [5] [5])*paiVar7)[0][lVar16] != (*paaiVar12)[0][0]) {
              vrna_message_warning("int11 enthalpies not symmetric");
            }
            paaiVar12 = (int (*) [5] [5])(*paaiVar12 + 1);
          }
          paaiVar6 = (int (*) [5] [5])((*paaiVar6)[0] + 1);
          paiVar7 = paiVar7 + 1;
        }
        paaiVar6 = (int (*) [5] [5])((long)local_1b0 + 800);
        paiVar7 = (int (*) [5])((long)local_1b8 + 100);
      }
      local_190 = (int (*) [5] [5] [5] [5])((long)local_190 + 100);
      local_198 = (int (*) [5] [5] [5] [5])((long)local_198 + 800);
    }
    local_180 = int22_37[0];
    local_188 = int22_37[0];
    for (paaaaiVar4 = (int (*) [5] [5] [5] [5])0x0; paaaaiVar4 != (int (*) [5] [5] [5] [5])0x8;
        paaaaiVar4 = (int (*) [5] [5] [5] [5])((long)paaaaiVar4 + 1)) {
      local_170 = local_180;
      local_178 = local_188;
      local_190 = paaaaiVar4;
      for (paaaaiVar5 = (int (*) [5] [5] [5] [5])0x0; paaaaiVar5 != (int (*) [5] [5] [5] [5])0x8;
          paaaaiVar5 = (int (*) [5] [5] [5] [5])((long)paaaaiVar5 + 1)) {
        local_160 = local_170;
        local_168 = local_178;
        local_198 = paaaaiVar5;
        for (local_1a8 = (int (*) [5] [5] [5] [5])0x0; local_1a8 != (int (*) [5] [5] [5] [5])0x5;
            local_1a8 = (int (*) [5] [5] [5] [5])((long)local_1a8 + 1)) {
          paaaaiVar17 = local_160;
          paaaaiVar22 = local_168;
          for (local_1a0 = (int (*) [5] [5] [5] [5])0x0; local_1a0 != (int (*) [5] [5] [5] [5])0x5;
              local_1a0 = (int (*) [5] [5] [5] [5])((long)local_1a0 + 1)) {
            local_1b8 = paaaaiVar17;
            local_1b0 = paaaaiVar22;
            for (lVar14 = 0; lVar14 != 5; lVar14 = lVar14 + 1) {
              paaaaiVar4 = paaaaiVar22;
              for (lVar16 = 0; lVar16 != 5; lVar16 = lVar16 + 1) {
                if ((*paaaaiVar17)[0][0][0][lVar16] != (*paaaaiVar4)[0][0][0][0]) {
                  vrna_message_warning("int22 energies not symmetric");
                }
                paaaaiVar4 = (int (*) [5] [5] [5] [5])((*paaaaiVar4)[0] + 1);
              }
              paaaaiVar22 = (int (*) [5] [5] [5] [5])(*paaaaiVar22 + 1);
              paaaaiVar17 = (int (*) [5] [5] [5] [5])((*paaaaiVar17)[0][0] + 1);
            }
            paaaaiVar22 = (int (*) [5] [5] [5] [5])((*local_1b0)[0][0][0] + 1);
            paaaaiVar17 = (int (*) [5] [5] [5] [5])((*local_1b8)[0] + 1);
            paaaaiVar4 = local_190;
            paaaaiVar5 = local_198;
          }
          local_168 = (int (*) [5] [5] [5] [5])((*local_168)[0][0] + 1);
          local_160 = (int (*) [5] [5] [5] [5])(*local_160 + 1);
        }
        local_178 = local_178 + 8;
        local_170 = local_170 + 1;
      }
      local_188 = local_188 + 1;
      local_180 = local_180 + 8;
    }
    local_188 = (int (*) [5] [5] [5] [5])CONCAT44(local_188._4_4_,1);
    local_178 = int22_dH[0];
    local_180 = int22_dH[0];
    for (paaaaiVar4 = (int (*) [5] [5] [5] [5])0x0; paaaaiVar4 != (int (*) [5] [5] [5] [5])0x8;
        paaaaiVar4 = (int (*) [5] [5] [5] [5])((long)paaaaiVar4 + 1)) {
      local_168 = local_178;
      local_170 = local_180;
      local_1b8 = paaaaiVar4;
      for (uVar19 = 0; uVar19 != 8; uVar19 = uVar19 + 1) {
        local_190 = local_168;
        local_160 = local_170;
        for (uVar21 = 0; uVar21 != 5; uVar21 = uVar21 + 1) {
          local_1a8 = local_160;
          paaaaiVar5 = local_190;
          for (lVar14 = 0; lVar14 != 5; lVar14 = lVar14 + 1) {
            paaaaiVar17 = local_1a8;
            local_198 = paaaaiVar5;
            for (lVar16 = 0; lVar16 != 5; lVar16 = lVar16 + 1) {
              local_1b0 = paaaaiVar5;
              local_1a0 = paaaaiVar17;
              for (lVar23 = 0; lVar23 != 5; lVar23 = lVar23 + 1) {
                if ((*paaaaiVar5)[0][0][0][lVar23] != (*paaaaiVar17)[0][0][0][0]) {
                  vrna_message_warning
                            ("int22 enthalpies not symmetric: %d %d %d %d %d %d",local_1b8,
                             uVar19 & 0xffffffff,uVar21 & 0xffffffff,lVar14,lVar16,(int)lVar23);
                  paaaaiVar5 = local_1b0;
                  paaaaiVar4 = local_1b8;
                }
                paaaaiVar17 = (int (*) [5] [5] [5] [5])((*paaaaiVar17)[0] + 1);
              }
              paaaaiVar17 = (int (*) [5] [5] [5] [5])(*local_1a0 + 1);
              paaaaiVar5 = (int (*) [5] [5] [5] [5])((*paaaaiVar5)[0][0] + 1);
            }
            local_1a8 = (int (*) [5] [5] [5] [5])((*local_1a8)[0][0][0] + 1);
            paaaaiVar5 = (int (*) [5] [5] [5] [5])((*local_198)[0] + 1);
          }
          local_160 = (int (*) [5] [5] [5] [5])((*local_160)[0][0] + 1);
          local_190 = (int (*) [5] [5] [5] [5])(*local_190 + 1);
        }
        local_170 = local_170 + 8;
        local_168 = local_168 + 1;
      }
      local_180 = local_180 + 1;
      local_178 = local_178 + 8;
    }
  }
  return (int)local_188;
}

Assistant:

PRIVATE int
set_parameters_from_string(char       **file_content,
                           const char *name)
{
  size_t      line_no;
  char        *line, ident[256];
  enum parset type;
  int         r;

  line_no = 0;

  if ((!file_content) ||
      (!file_content[line_no]))
    return 0;

  /* store file name of parameter data set */
  free(last_param_file);
  last_param_file = (name) ? strdup(name) : NULL;
  // free(last_param_file);

  if (strncmp(file_content[line_no++], "## RNAfold parameter file v2.0", 30) != 0) {
    vrna_message_warning("Missing header line in file.\n"
                         "May be this file has not v2.0 format.\n"
                         "Use INTERRUPT-key to stop.");
  }

  while ((line = file_content[line_no++])) {
    r = sscanf(line, "# %255s", ident);
    if (r == 1) {
      type = gettype(ident);
      switch (type) {
        case QUIT:
          break;
        case S:
          rd_2dim(file_content, &line_no, &(stack37[0][0]), stack_dim, stack_shift);
          break;
        case S_H:
          rd_2dim(file_content, &line_no, &(stackdH[0][0]), stack_dim, stack_shift);
          break;
        case HP:
          rd_1dim(file_content, &line_no, &(hairpin37[0]), 31, 0);
          break;
        case HP_H:
          rd_1dim(file_content, &line_no, &(hairpindH[0]), 31, 0);
          break;
        case B:
          rd_1dim(file_content, &line_no, &(bulge37[0]), 31, 0);
          break;
        case B_H:
          rd_1dim(file_content, &line_no, &(bulgedH[0]), 31, 0);
          break;
        case IL:
          rd_1dim(file_content, &line_no, &(internal_loop37[0]), 31, 0);
          break;
        case IL_H:
          rd_1dim(file_content, &line_no, &(internal_loopdH[0]), 31, 0);
          break;
        case MME:
          rd_3dim(file_content, &line_no, &(mismatchExt37[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MME_H:
          rd_3dim(file_content, &line_no, &(mismatchExtdH[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMH:
          rd_3dim(file_content, &line_no, &(mismatchH37[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMH_H:
          rd_3dim(file_content, &line_no, &(mismatchHdH[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMI:
          rd_3dim(file_content, &line_no, &(mismatchI37[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMI_H:
          rd_3dim(file_content, &line_no, &(mismatchIdH[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMI1N:
          rd_3dim(file_content, &line_no, &(mismatch1nI37[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMI1N_H:
          rd_3dim(file_content, &line_no, &(mismatch1nIdH[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMI23:
          rd_3dim(file_content, &line_no, &(mismatch23I37[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMI23_H:
          rd_3dim(file_content, &line_no, &(mismatch23IdH[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMM:
          rd_3dim(file_content, &line_no, &(mismatchM37[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMM_H:
          rd_3dim(file_content, &line_no, &(mismatchMdH[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case INT11:
          rd_4dim(file_content, &line_no, &(int11_37[0][0][0][0]),
                  int11_dim,
                  int11_shift);
          break;
        case INT11_H:
          rd_4dim(file_content, &line_no, &(int11_dH[0][0][0][0]),
                  int11_dim,
                  int11_shift);
          break;
        case INT21:
          rd_5dim(file_content, &line_no, &(int21_37[0][0][0][0][0]),
                  int21_dim,
                  int21_shift);
          break;
        case INT21_H:
          rd_5dim(file_content, &line_no, &(int21_dH[0][0][0][0][0]),
                  int21_dim,
                  int21_shift);
          break;
        case INT22:
          rd_6dim_slice(file_content, &line_no, &(int22_37[0][0][0][0][0][0]),
                        int22_dim,
                        int22_shift,
                        int22_post);
          update_nst(int22_37);
          break;
        case INT22_H:
          rd_6dim_slice(file_content, &line_no, &(int22_dH[0][0][0][0][0][0]),
                        int22_dim,
                        int22_shift,
                        int22_post);
          update_nst(int22_dH);
          break;
        case D5:
          rd_2dim(file_content, &line_no, &(dangle5_37[0][0]),
                  dangle_dim,
                  dangle_shift);
          break;
        case D5_H:
          rd_2dim(file_content, &line_no, &(dangle5_dH[0][0]),
                  dangle_dim,
                  dangle_shift);
          break;
        case D3:
          rd_2dim(file_content, &line_no, &(dangle3_37[0][0]),
                  dangle_dim,
                  dangle_shift);
          break;
        case D3_H:
          rd_2dim(file_content, &line_no, &(dangle3_dH[0][0]),
                  dangle_dim,
                  dangle_shift);
          break;
        case ML:
        {
          int values[6];
          rd_1dim(file_content, &line_no, &values[0], 6, 0);
          ML_BASE37     = values[0];
          ML_BASEdH     = values[1];
          ML_closing37  = values[2];
          ML_closingdH  = values[3];
          ML_intern37   = values[4];
          ML_interndH   = values[5];
        }
        break;
        case NIN:
        {
          int values[3];
          rd_1dim(file_content, &line_no, &values[0], 3, 0);
          ninio37   = values[0];
          niniodH   = values[1];
          MAX_NINIO = values[2];
        }
        break;
        case MISC:
        {
          int values[4];
          rd_1dim(file_content, &line_no, &values[0], 4, 0);
          DuplexInit37  = values[0];
          DuplexInitdH  = values[1];
          TerminalAU37  = values[2];
          TerminalAUdH  = values[3];
        }
        break;
        case TL:
          rd_Tetraloop37(file_content, &line_no);
          break;
        case TRI:
          rd_Triloop37(file_content, &line_no);
          break;
        case HEX:
          rd_Hexaloop37(file_content, &line_no);
          break;
        default:      /* do nothing but complain */
          vrna_message_warning("read_epars: Unknown field identifier in `%s'", line);
      }
    } /* else ignore line */
  }

  check_symmetry();
  return 1;
}